

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O0

bool __thiscall wasm::HeapType::isBottom(HeapType *this)

{
  bool bVar1;
  BasicHeapType BVar2;
  HeapType *this_local;
  
  bVar1 = isBasic(this);
  if (bVar1) {
    BVar2 = getBasic(this,Unshared);
    switch(BVar2) {
    case ext:
    case func:
    case cont:
    case any:
    case eq:
    case i31:
    case struct_:
    case array:
    case exn:
    case string:
      this_local._7_1_ = false;
      break;
    default:
      goto LAB_0022256d;
    case none:
    case noext:
    case nofunc:
    case nocont:
    case noexn:
      this_local._7_1_ = true;
    }
  }
  else {
LAB_0022256d:
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool HeapType::isBottom() const {
  if (isBasic()) {
    switch (getBasic(Unshared)) {
      case ext:
      case func:
      case cont:
      case any:
      case eq:
      case i31:
      case struct_:
      case array:
      case exn:
      case string:
        return false;
      case none:
      case noext:
      case nofunc:
      case nocont:
      case noexn:
        return true;
    }
  }
  return false;
}